

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_next_window.cpp
# Opt level: O0

vector<rw::Window_*,_std::allocator<rw::Window_*>_> *
rw::window_with_greatest_perpendicular_overlap
          (vector<rw::Window_*,_std::allocator<rw::Window_*>_> *__return_storage_ptr__,
          Window *focused_window,vector<rw::Window_*,_std::allocator<rw::Window_*>_> *other_windows,
          Direction *direction)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  _Tuple_impl<0UL,_int,_int> _Stack_88;
  int small_difference;
  _Tuple_impl<0UL,_int,_int> local_80;
  int local_78;
  int overlap;
  _Tuple_impl<0UL,_int,_int> local_68;
  tuple<int,_int> other_range;
  Window **other;
  const_iterator __end1;
  const_iterator __begin1;
  vector<rw::Window_*,_std::allocator<rw::Window_*>_> *__range1;
  int local_38;
  int best_overlap;
  bool best_overlap_set;
  tuple<int,_int> focused_range;
  Direction *direction_local;
  vector<rw::Window_*,_std::allocator<rw::Window_*>_> *other_windows_local;
  Window *focused_window_local;
  vector<rw::Window_*,_std::allocator<rw::Window_*>_> *best_windows;
  
  focused_range.super__Tuple_impl<0UL,_int,_int> = (_Tuple_impl<0UL,_int,_int>)direction;
  (**(code **)(*(long *)direction + 0x28))(&best_overlap,direction,focused_window);
  bVar1 = false;
  std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>::begin(other_windows);
  other = (Window **)std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>::end(other_windows);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<rw::Window_*const_*,_std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>_>
                                     *)&other), bVar2) {
    other_range.super__Tuple_impl<0UL,_int,_int> =
         (_Tuple_impl<0UL,_int,_int>)
         __gnu_cxx::
         __normal_iterator<rw::Window_*const_*,_std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>_>
         ::operator*(&__end1);
    (**(code **)(*(long *)focused_range.super__Tuple_impl<0UL,_int,_int> + 0x28))
              (&local_68,focused_range.super__Tuple_impl<0UL,_int,_int>,
               *(Window **)other_range.super__Tuple_impl<0UL,_int,_int>);
    local_80 = _best_overlap;
    _Stack_88 = local_68;
    iVar3 = overlap_length((tuple<int,_int> *)&local_80,(tuple<int,_int> *)&stack0xffffffffffffff78)
    ;
    local_78 = iVar3;
    if ((!bVar1) || (0x32 < iVar3 - local_38)) {
      bVar1 = true;
      std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>::clear(__return_storage_ptr__);
      local_38 = iVar3;
    }
    iVar3 = local_78 - local_38;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    if (iVar3 < 0x33) {
      std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>::push_back
                (__return_storage_ptr__,(value_type *)other_range.super__Tuple_impl<0UL,_int,_int>);
    }
    __gnu_cxx::
    __normal_iterator<rw::Window_*const_*,_std::vector<rw::Window_*,_std::allocator<rw::Window_*>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Window*> window_with_greatest_perpendicular_overlap(
            Window* focused_window,
            const vector<Window*> other_windows,
            Direction * direction)
    {
        auto focused_range = direction->perpendicular_range(focused_window);

        bool best_overlap_set = false;
        int best_overlap;
        vector<Window*> best_windows;

        for (auto& other : other_windows) {
            auto other_range = direction->perpendicular_range(other);

            int overlap = overlap_length(focused_range, other_range);
            // Note: small overlap differences as treated as if there was no
            // difference. This is because in practice these small differences
            // are side effects of splitting the screen when the height or width
            // is not even.
            const int small_difference = 50;

            if (!best_overlap_set || (overlap - best_overlap > small_difference)) {
                best_overlap_set = true;
                best_overlap = overlap;
                best_windows.clear();
            }

            if (abs(overlap - best_overlap) <= small_difference) {
                best_windows.push_back(other);
            }
        }

        return best_windows;
    }